

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

int __thiscall Server::open(Server *this,char *__file,int __oflag,...)

{
  int extraout_EAX;
  mapped_type *this_00;
  undefined1 local_f0 [8];
  ServerFile entry;
  undefined1 local_60 [8];
  SourceFile file;
  string *text_local;
  string *uri_local;
  Server *this_local;
  
  file.content.field_2._8_8_ = ___oflag;
  std::__cxx11::string::string((string *)local_60,(string *)__file);
  std::__cxx11::string::string((string *)(file.filename.field_2._M_local_buf + 8),___oflag);
  soul::SourceFile::SourceFile((SourceFile *)local_f0,(SourceFile *)local_60);
  std::__cxx11::string::string((string *)(entry.file.content.field_2._M_local_buf + 8),___oflag);
  std::__cxx11::string::string((string *)(entry.text.field_2._M_local_buf + 8),(string *)__file);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile>_>_>
            ::operator[](&fileMap_abi_cxx11_,(key_type *)__file);
  ServerFile::operator=(this_00,(ServerFile *)local_f0);
  ServerFile::~ServerFile((ServerFile *)local_f0);
  soul::SourceFile::~SourceFile((SourceFile *)local_60);
  return extraout_EAX;
}

Assistant:

void Server::open(std::string uri, std::string text)
{
    auto file = soul::SourceFile{uri, text};
    auto entry = ServerFile{
        file,
        text,
        uri};
    fileMap[uri] = entry;
}